

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void expr_free_node(Parser *psr,Node *node)

{
  FnScope *pFVar1;
  uint uVar2;
  
  if ((node->type == NODE_NON_RELOC) &&
     (pFVar1 = psr->scope,
     psr->locals_count - pFVar1->first_local <= (int)(uint)(node->field_1).slot)) {
    uVar2 = pFVar1->next_slot - 1;
    pFVar1->next_slot = uVar2;
    if (uVar2 != (node->field_1).slot) {
      __assert_fail("node->slot == psr->scope->next_slot",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x229,"void expr_free_node(Parser *, Node *)");
    }
  }
  return;
}

Assistant:

static void expr_free_node(Parser *psr, Node *node) {
	// The number of locals assigned a name (i.e. that are not temporary) in the
	// current function definition scope
	int active_locals = psr->locals_count - psr->scope->first_local;

	// Check the node is a non-reloc and is temporary
	if (node->type == NODE_NON_RELOC && node->slot >= active_locals) {
		// Free the top most stack slot
		psr->scope->next_slot--;

		// Make sure we actually freed the temporary local that was on top of
		// the stack
		assert(node->slot == psr->scope->next_slot);
	}
}